

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O3

int floor0_inverse2(vorbis_block *vb,vorbis_look_floor *i,void *memo,float *out)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  lVar7 = *(long *)((long)i + 8);
  lVar2 = *(long *)((long)i + 0x18);
  if (*(long *)(lVar7 + vb->W * 8) == 0) {
    lVar9 = (long)(int)vb->W;
    lVar7 = *(long *)((long)vb->vd->vi->codec_setup + lVar9 * 8) / 2;
    iVar1 = *i;
    dVar13 = atan((double)((float)*(long *)(lVar2 + 8) * 0.5 * 0.00074));
    fVar12 = (float)*(long *)(lVar2 + 8) * 0.5;
    dVar14 = atan((double)(fVar12 * fVar12 * 1.85e-08));
    lVar10 = *(long *)(lVar2 + 8);
    pvVar3 = malloc((lVar7 << 0x20) + 0x100000000 >> 0x1e);
    *(void **)(*(long *)((long)i + 8) + lVar9 * 8) = pvVar3;
    uVar5 = (uint)lVar7;
    if ((int)uVar5 < 1) {
      lVar7 = *(long *)((long)i + 8);
      lVar4 = *(long *)(lVar7 + lVar9 * 8);
      uVar8 = 0;
    }
    else {
      fVar12 = (float)lVar10;
      fVar17 = (float)(int)uVar5;
      uVar8 = (ulong)(uVar5 & 0x7fffffff);
      uVar11 = 0;
      do {
        fVar18 = (float)(int)uVar11;
        dVar15 = atan((double)((((float)lVar10 * 0.5) / fVar17) * fVar18 * 0.00074));
        fVar19 = (((float)*(long *)(lVar2 + 8) * 0.5) / fVar17) * fVar18;
        dVar16 = atan((double)(fVar19 * fVar19 * 1.85e-08));
        lVar10 = *(long *)(lVar2 + 8);
        dVar15 = floor((dVar16 * 2.240000009536743 + dVar15 * 13.100000381469727 +
                       (double)((((float)lVar10 * 0.5) / fVar17) * fVar18 * 0.0001)) *
                       (double)(float)((double)iVar1 /
                                      ((double)(fVar12 * 0.5 * 0.0001) +
                                      dVar13 * 13.100000381469727 + dVar14 * 2.240000009536743)));
        iVar6 = *i + -1;
        if ((int)dVar15 < *i) {
          iVar6 = (int)dVar15;
        }
        lVar7 = *(long *)((long)i + 8);
        lVar4 = *(long *)(lVar7 + lVar9 * 8);
        *(int *)(lVar4 + uVar11 * 4) = iVar6;
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
    }
    *(undefined4 *)(lVar4 + uVar8 * 4) = 0xffffffff;
    *(uint *)((long)i + lVar9 * 4 + 0x10) = uVar5;
  }
  if (memo == (void *)0x0) {
    memset(out,0,(long)*(int *)((long)i + vb->W * 4 + 0x10) << 2);
  }
  else {
    vorbis_lsp_to_curve(out,*(int **)(lVar7 + vb->W * 8),*(int *)((long)i + vb->W * 4 + 0x10),*i,
                        (float *)memo,*(int *)((long)i + 4),
                        *(float *)((long)memo + (long)*(int *)((long)i + 4) * 4),
                        (float)*(int *)(lVar2 + 0x1c));
  }
  return (uint)(memo != (void *)0x0);
}

Assistant:

static int floor0_inverse2(vorbis_block *vb,vorbis_look_floor *i,
                           void *memo,float *out){
  vorbis_look_floor0 *look=(vorbis_look_floor0 *)i;
  vorbis_info_floor0 *info=look->vi;

  floor0_map_lazy_init(vb,info,look);

  if(memo){
    float *lsp=(float *)memo;
    float amp=lsp[look->m];

    /* take the coefficients back to a spectral envelope curve */
    vorbis_lsp_to_curve(out,
                        look->linearmap[vb->W],
                        look->n[vb->W],
                        look->ln,
                        lsp,look->m,amp,(float)info->ampdB);
    return(1);
  }
  memset(out,0,sizeof(*out)*look->n[vb->W]);
  return(0);
}